

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O3

feed_db_status_t init_feed_db(feed_db_t *db,char *db_path,int writable)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = strdup(db_path);
  db->path = pcVar2;
  db->rc = -1;
  db->error_msg = (char *)0x0;
  db->open = 0;
  db->in_transaction = 0;
  iVar1 = sqlite3_open_v2(db_path,&db->conn,(uint)(writable != 0) * 5 + 1,(char *)0x0);
  db->rc = iVar1;
  if (iVar1 == 0) {
    db->open = 1;
  }
  else {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  return (feed_db_status_t)(iVar1 == 0);
}

Assistant:

feed_db_status_t init_feed_db(feed_db_t *db, const char *db_path, int writable) {
    db->path = strdup(db_path);
    db->rc = -1;
    db->error_msg = NULL;
    db->open = 0;
    db->in_transaction = 0;

    db->rc = sqlite3_open_v2(db_path, &(db->conn),
        writable ? (SQLITE_OPEN_CREATE | SQLITE_OPEN_READWRITE) : (SQLITE_OPEN_READONLY),
        NULL);

    if (db->rc) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        return FEED_DB_ERROR;
    }

    db->open = 1;
    return FEED_DB_SUCCESS;
}